

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kdtree.c
# Opt level: O0

int32 read_bbi_list(FILE *fp,kd_tree_node_t *node,int32 maxbbi)

{
  int32 iVar1;
  int iVar2;
  uint8 *puVar3;
  int local_130;
  int nr;
  int nbbi;
  int bbi;
  uint8 bbi_list [256];
  int32 maxbbi_local;
  kd_tree_node_t *node_local;
  FILE *fp_local;
  
  local_130 = 0;
  bbi_list._252_4_ = maxbbi;
  if (maxbbi == -1) {
    bbi_list[0xfc] = '\0';
    bbi_list[0xfd] = '\x01';
    bbi_list[0xfe] = '\0';
    bbi_list[0xff] = '\0';
  }
  iVar1 = read_tree_int(fp,"bbi",&nr,1);
  if (iVar1 < 0) {
    fp_local._4_4_ = -1;
  }
  else {
    if (1 < iVar1) {
      if (0xff < nr) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kdtree.c"
                ,0x67,"BBI Gaussian %d out of range! %d\n",(ulong)(uint)nr);
        return -1;
      }
      nbbi._0_1_ = (undefined1)nr;
      local_130 = 1;
      while ((iVar2 = __isoc99_fscanf(fp,"%d",&nr), iVar2 != 0 &&
             (iVar2 = feof((FILE *)fp), iVar2 == 0))) {
        if (0xff < nr) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kdtree.c"
                  ,0x70,"BBI Gaussian %d out of range!\n",(ulong)(uint)nr);
          return -1;
        }
        if (local_130 < (int)bbi_list._252_4_) {
          *(char *)((long)&nbbi + (long)local_130) = (char)nr;
          local_130 = local_130 + 1;
        }
      }
    }
    if (node == (kd_tree_node_t *)0x0) {
      fp_local._4_4_ = 0;
    }
    else {
      if ((int)bbi_list._252_4_ < local_130) {
        local_130._0_1_ = bbi_list[0xfc];
        local_130._1_1_ = bbi_list[0xfd];
        local_130._2_1_ = bbi_list[0xfe];
        local_130._3_1_ = bbi_list[0xff];
      }
      node->n_bbi = (uint16)local_130;
      if (local_130 != 0) {
        puVar3 = (uint8 *)__ckd_calloc__((ulong)node->n_bbi,1,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kdtree.c"
                                         ,0x7d);
        node->bbi = puVar3;
        memcpy(node->bbi,&nbbi,(ulong)node->n_bbi);
      }
      fp_local._4_4_ = 0;
    }
  }
  return fp_local._4_4_;
}

Assistant:

static int32
read_bbi_list(FILE * fp, kd_tree_node_t * node, int32 maxbbi)
{
    uint8 bbi_list[S2_NUM_ALPHABET];
    int bbi, nbbi = 0, nr;

    if (maxbbi == -1)
        maxbbi = S2_NUM_ALPHABET;
    if ((nr = read_tree_int(fp, "bbi", &bbi, TRUE)) < 0)
        return -1;
    if (nr > 1) {
        if (bbi >= S2_NUM_ALPHABET) {
            E_ERROR("BBI Gaussian %d out of range! %d\n", bbi);
            return -1;
        }
        bbi_list[0] = bbi;
        nbbi = 1;
        while (fscanf(fp, "%d", &bbi)) {
            if (feof(fp))
                break;
            if (bbi >= S2_NUM_ALPHABET) {
                E_ERROR("BBI Gaussian %d out of range!\n", bbi);
                return -1;
            }
            if (nbbi < maxbbi)
                bbi_list[nbbi++] = bbi;
        }
    }
    if (node == NULL)
        return 0;
    if (nbbi > maxbbi)
        nbbi = maxbbi;
    node->n_bbi = nbbi;
    if (nbbi) {
        node->bbi = ckd_calloc(node->n_bbi, sizeof(*node->bbi));
        memcpy(node->bbi, bbi_list, node->n_bbi * sizeof(*node->bbi));
    }
    return 0;
}